

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O3

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitIf(SubtypingDiscoverer<NullFixer> *this,If *curr)

{
  Type b;
  
  if ((curr->ifFalse != (Expression *)0x0) &&
     (b.id = (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id,
     b.id != 1)) {
    StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
    Type_(this + -0x58,curr->ifTrue,b);
    StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
    Type_(this + -0x58,curr->ifFalse,
          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id);
    return;
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (curr->ifFalse && curr->type != Type::unreachable) {
      self()->noteSubtype(curr->ifTrue, curr);
      self()->noteSubtype(curr->ifFalse, curr);
    }
  }